

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.h
# Opt level: O3

void __thiscall sptk::GaussianMixtureModeling::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011faf0;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
            (&this->precisions_);
  pdVar1 = (this->gconsts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }